

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O1

CurrencyAmount * __thiscall
icu_63::NumberFormat::parseCurrency(NumberFormat *this,UnicodeString *text,ParsePosition *pos)

{
  int iVar1;
  bool bVar2;
  NumberFormat *pNVar3;
  char16_t *size;
  UErrorCode ec;
  UChar curr [4];
  Formattable parseResult;
  UErrorCode local_bc;
  ConstChar16Ptr local_b8;
  char16_t *local_b0;
  char16_t local_a0 [4];
  Formattable local_98;
  
  Formattable::Formattable(&local_98);
  iVar1 = pos->index;
  (*(this->super_Format).super_UObject._vptr_UObject[0x14])(this,text,&local_98,pos);
  if (pos->index != iVar1) {
    local_bc = U_ZERO_ERROR;
    size = local_a0;
    (*(this->super_Format).super_UObject._vptr_UObject[0x24])(this);
    if (local_bc < U_ILLEGAL_ARGUMENT_ERROR) {
      pNVar3 = (NumberFormat *)UMemory::operator_new((UMemory *)0x80,(size_t)size);
      if (pNVar3 == (NumberFormat *)0x0) {
        this = (NumberFormat *)0x0;
      }
      else {
        local_b8.p_ = local_a0;
        CurrencyAmount::CurrencyAmount((CurrencyAmount *)pNVar3,&local_98,&local_b8,&local_bc);
        this = pNVar3;
      }
      if ((this == (NumberFormat *)0x0) && (local_bc < U_ILLEGAL_ARGUMENT_ERROR)) {
        local_bc = U_MEMORY_ALLOCATION_ERROR;
      }
      if (pNVar3 != (NumberFormat *)0x0) {
        local_b0 = local_b8.p_;
      }
      bVar2 = U_ZERO_ERROR < local_bc;
      if (local_bc < U_ILLEGAL_ARGUMENT_ERROR) {
        pNVar3 = (NumberFormat *)0x0;
      }
      else {
        pos->index = iVar1;
        pNVar3 = this;
      }
      if (pNVar3 != (NumberFormat *)0x0) {
        (*(pNVar3->super_Format).super_UObject._vptr_UObject[1])();
      }
    }
    else {
      bVar2 = true;
    }
    if (!bVar2) goto LAB_0022a046;
  }
  this = (NumberFormat *)0x0;
LAB_0022a046:
  Formattable::~Formattable(&local_98);
  return (CurrencyAmount *)this;
}

Assistant:

CurrencyAmount* NumberFormat::parseCurrency(const UnicodeString& text,
                                            ParsePosition& pos) const {
    // Default implementation only -- subclasses should override
    Formattable parseResult;
    int32_t start = pos.getIndex();
    parse(text, parseResult, pos);
    if (pos.getIndex() != start) {
        UChar curr[4];
        UErrorCode ec = U_ZERO_ERROR;
        getEffectiveCurrency(curr, ec);
        if (U_SUCCESS(ec)) {
            LocalPointer<CurrencyAmount> currAmt(new CurrencyAmount(parseResult, curr, ec), ec);
            if (U_FAILURE(ec)) {
                pos.setIndex(start); // indicate failure
            } else {
                return currAmt.orphan();
            }
        }
    }
    return NULL;
}